

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void dr_prediction_z1_32xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  uint8_t uVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  undefined1 (*pauVar10) [32];
  ulong uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [32];
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  __m256i dstvec [64];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined8 local_860 [262];
  undefined1 auVar18 [32];
  
  uVar1 = above[(long)N + 0x1f];
  auVar17[1] = uVar1;
  auVar17[0] = uVar1;
  auVar17[2] = uVar1;
  auVar17[3] = uVar1;
  auVar17[4] = uVar1;
  auVar17[5] = uVar1;
  auVar17[6] = uVar1;
  auVar17[7] = uVar1;
  auVar17[8] = uVar1;
  auVar17[9] = uVar1;
  auVar17[10] = uVar1;
  auVar17[0xb] = uVar1;
  auVar17[0xc] = uVar1;
  auVar17[0xd] = uVar1;
  auVar17[0xe] = uVar1;
  auVar17[0xf] = uVar1;
  auVar18[0x10] = uVar1;
  auVar18._0_16_ = auVar17;
  auVar18[0x11] = uVar1;
  auVar18[0x12] = uVar1;
  auVar18[0x13] = uVar1;
  auVar18[0x14] = uVar1;
  auVar18[0x15] = uVar1;
  auVar18[0x16] = uVar1;
  auVar18[0x17] = uVar1;
  auVar18[0x18] = uVar1;
  auVar18[0x19] = uVar1;
  auVar18[0x1a] = uVar1;
  auVar18[0x1b] = uVar1;
  auVar18[0x1c] = uVar1;
  auVar18[0x1d] = uVar1;
  auVar18[0x1e] = uVar1;
  auVar18[0x1f] = uVar1;
  uVar11 = 0;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  uVar12 = (ulong)(uint)N;
  pauVar13 = (undefined1 (*) [32])local_860;
  auVar19._8_2_ = 0x10;
  auVar19._0_8_ = 0x10001000100010;
  auVar19._10_2_ = 0x10;
  auVar19._12_2_ = 0x10;
  auVar19._14_2_ = 0x10;
  auVar19._16_2_ = 0x10;
  auVar19._18_2_ = 0x10;
  auVar19._20_2_ = 0x10;
  auVar19._22_2_ = 0x10;
  auVar19._24_2_ = 0x10;
  auVar19._26_2_ = 0x10;
  auVar19._28_2_ = 0x10;
  auVar19._30_2_ = 0x10;
  uVar16 = upsample_above;
  do {
    if (uVar11 == uVar6) break;
    iVar8 = (int)uVar16 >> 6;
    uVar14 = (N + 0x1f) - iVar8;
    pauVar10 = pauVar13;
    uVar15 = uVar12;
    if (uVar14 == 0 || N + 0x1f < iVar8) {
      while (uVar15 != 0) {
        *pauVar10 = auVar18;
        pauVar10 = pauVar10 + 1;
        uVar15 = uVar15 - 1;
      }
    }
    else {
      uVar2 = (ushort)(uVar16 >> 1);
      uVar20 = uVar2 & 0x1f;
      auVar21._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f;
      auVar21._8_2_ = uVar20;
      auVar21._10_2_ = uVar20;
      auVar21._12_2_ = uVar20;
      auVar21._14_2_ = uVar20;
      auVar21._16_2_ = uVar20;
      auVar21._18_2_ = uVar20;
      auVar21._20_2_ = uVar20;
      auVar21._22_2_ = uVar20;
      auVar21._24_2_ = uVar20;
      auVar21._26_2_ = uVar20;
      auVar21._28_2_ = uVar20;
      auVar21._30_2_ = uVar20;
      for (uVar15 = 0; uVar15 != 0x20; uVar15 = uVar15 + 0x10) {
        auVar22 = auVar18;
        if (uVar15 < uVar14) {
          auVar22 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar15 + (long)iVar8));
          auVar23 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar15 + (long)iVar8 + 1));
          auVar23 = vpsubw_avx2(auVar23,auVar22);
          auVar23 = vpmullw_avx2(auVar23,auVar21);
          auVar22 = vpsllw_avx2(auVar22,5);
          auVar22 = vpaddw_avx2(auVar22,auVar19);
          auVar22 = vpaddw_avx2(auVar23,auVar22);
          auVar22 = vpsrlw_avx2(auVar22,5);
          auVar23._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar22._16_16_;
          auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
          auVar22 = vpackuswb_avx2(auVar22,auVar23);
        }
        *(undefined1 (*) [32])(local_8a0 + uVar15 * 2) = auVar22;
      }
      uVar9 = 0x20;
      if (uVar14 < 0x20) {
        uVar9 = uVar14;
      }
      auVar21 = vperm2i128_avx2(local_8a0,local_880,0x20);
      auVar21 = vpblendvb_avx2(auVar18,auVar21,*(undefined1 (*) [32])(BaseMask[0] + (uVar9 << 5)));
      *(undefined1 (*) [32])(local_860 + uVar11 * 4) = auVar21;
      uVar16 = uVar16 + upsample_above;
    }
    uVar11 = uVar11 + 1;
    uVar12 = uVar12 - 1;
    pauVar13 = pauVar13 + 1;
  } while (0 < (int)uVar14);
  for (lVar7 = 0; uVar6 * 0x20 != lVar7; lVar7 = lVar7 + 0x20) {
    uVar3 = *(undefined8 *)((long)local_860 + lVar7 + 8);
    uVar4 = *(undefined8 *)((long)local_860 + lVar7 + 0x10);
    uVar5 = *(undefined8 *)((long)local_860 + lVar7 + 0x18);
    *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar7);
    *(undefined8 *)(dst + 8) = uVar3;
    *(undefined8 *)(dst + 0x10) = uVar4;
    *(undefined8 *)(dst + 0x18) = uVar5;
    dst = dst + stride;
  }
  return;
}

Assistant:

static void dr_prediction_z1_32xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *above, int upsample_above,
                                       int dx) {
  __m256i dstvec[64];
  dr_prediction_z1_32xN_internal_avx2(N, dstvec, above, upsample_above, dx);
  for (int i = 0; i < N; i++) {
    _mm256_storeu_si256((__m256i *)(dst + stride * i), dstvec[i]);
  }
}